

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O0

void __thiscall QPainter::fillRect(QPainter *this,QRect *r,QColor *color)

{
  bool bVar1;
  QPainterPrivate *this_00;
  QBrush *in_RDX;
  QRect *in_RSI;
  QRect *in_RDI;
  long in_FS_OFFSET;
  QPainterPrivate *d;
  char *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  BrushStyle style;
  QPaintEngineEx *pQVar2;
  QRect *this_01;
  undefined1 local_48 [32];
  char local_28 [32];
  long local_8;
  
  style = (BrushStyle)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = d_func((QPainter *)0x5a3e7a);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor> *)0x5a3e90);
  if (bVar1) {
    if (this_00->extended == (QPaintEngineEx *)0x0) {
      QBrush::QBrush((QBrush *)this_00,(QColor *)in_RDI,style);
      fillRect((QPainter *)this_01,in_RSI,in_RDX);
      QBrush::~QBrush((QBrush *)0x5a3f42);
    }
    else {
      pQVar2 = this_00->extended;
      QRectF::QRectF((QRectF *)this_00,in_RDI);
      (*(pQVar2->super_QPaintEngine)._vptr_QPaintEngine[0x29])(pQVar2,local_48,in_RDX);
    }
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)this_00,(char *)in_RDI,style,in_stack_ffffffffffffff78);
    QMessageLogger::warning(local_28,"QPainter::fillRect: Painter not active");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPainter::fillRect(const QRect &r, const QColor &color)
{
    Q_D(QPainter);

    if (!d->engine) {
        qWarning("QPainter::fillRect: Painter not active");
        return;
    }

    if (d->extended) {
        d->extended->fillRect(r, color);
        return;
    }

    fillRect(r, QBrush(color));
}